

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
CheckPackageMempoolAcceptResult_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Package *txns,PackageMempoolAcceptResult *result,
          bool expect_valid,CTxMemPool *mempool)

{
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *plVar1;
  ModeState MVar2;
  ResultType RVar3;
  ResultType RVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer phVar6;
  pointer pcVar7;
  pointer pcVar8;
  long lVar9;
  pointer phVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *pvVar13;
  _List_node_base *p_Var14;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  char *pcVar17;
  string *__return_storage_ptr___00;
  CTxMemPool *args_1;
  base_blob<256u> *this;
  long in_FS_OFFSET;
  bool bVar18;
  bool bVar19;
  initializer_list<uint256> __l;
  undefined1 local_b9;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  undefined1 local_a8 [32];
  uchar uStack_88;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  cluster;
  string local_58;
  long local_38;
  
  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT71(in_register_00000009,expect_valid);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MVar2 = (result->m_state).super_ValidationState<PackageValidationResult>.m_mode;
  if ((int)pbVar15 == 0) {
    if (MVar2 != M_VALID) goto LAB_0069d0a2;
    ValidationState<PackageValidationResult>::ToString_abi_cxx11_
              (&local_58,(ValidationState<PackageValidationResult> *)result);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_a8,(tinyformat *)"Package validation unexpectedly succeeded. %s",
               (char *)&local_58,pbVar15);
LAB_0069d41d:
    pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,pbVar15);
LAB_0069d42b:
    std::__cxx11::string::~string((string *)pbVar15);
    __return_storage_ptr___00 = &local_58;
  }
  else {
    if (MVar2 == M_INVALID) {
      ValidationState<PackageValidationResult>::ToString_abi_cxx11_
                (&local_58,(ValidationState<PackageValidationResult> *)result);
      tinyformat::format<std::__cxx11::string>
                ((string *)local_a8,(tinyformat *)"Package validation unexpectedly failed: %s",
                 (char *)&local_58,pbVar15);
      goto LAB_0069d41d;
    }
LAB_0069d0a2:
    pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (txns->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (txns->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((result->m_state).super_ValidationState<PackageValidationResult>.m_result == PCKG_POLICY) {
LAB_0069d0c7:
      args_1 = mempool;
      for (; pbVar15 != pbVar5;
          pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pbVar15->field_2) {
        pcVar7 = (pbVar15->_M_dataplus)._M_p;
        this = (base_blob<256u> *)(pcVar7 + 0x59);
        pbVar16 = pbVar5;
        sVar11 = std::
                 map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 ::count(&result->m_tx_results,(key_type *)this);
        if (sVar11 == 0) {
          base_blob<256u>::ToString_abi_cxx11_(&local_58,this);
          tinyformat::format<std::__cxx11::string>
                    ((string *)local_a8,(tinyformat *)"result not found for tx %s",(char *)&local_58
                     ,pbVar16);
          goto LAB_0069d41d;
        }
        pmVar12 = std::
                  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  ::at(&result->m_tx_results,(key_type *)this);
        RVar3 = pmVar12->m_result_type;
        if ((expect_valid) &&
           ((pmVar12->m_state).super_ValidationState<TxValidationResult>.m_mode == M_INVALID)) {
          base_blob<256u>::ToString_abi_cxx11_(&local_58,this);
          ValidationState<TxValidationResult>::ToString_abi_cxx11_
                    ((string *)&cluster,
                     &(pmVar12->m_state).super_ValidationState<TxValidationResult>);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_a8,(tinyformat *)"tx %s unexpectedly failed: %s",
                     (char *)&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cluster,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
          std::__cxx11::string::~string((string *)local_a8);
          pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cluster;
          goto LAB_0069d42b;
        }
        if (100 < (pmVar12->m_replaced_transactions).
                  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl._M_node._M_size) {
          base_blob<256u>::ToString_abi_cxx11_(&local_58,this);
          tinyformat::format<std::__cxx11::string>
                    ((string *)local_a8,(tinyformat *)"tx %s result replaced too many transactions",
                     (char *)&local_58,pbVar16);
          goto LAB_0069d41d;
        }
        plVar1 = &pmVar12->m_replaced_transactions;
        p_Var14 = (plVar1->
                  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        if (p_Var14 != (_List_node_base *)plVar1) {
          if ((pmVar12->m_wtxids_fee_calculations).
              super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ._M_engaged == true) {
            pvVar13 = std::
                      optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                      ::value(&pmVar12->m_wtxids_fee_calculations);
            pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)(pvVar13->
                             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar13->
                            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40 < pbVar16)
            {
              base_blob<256u>::ToString_abi_cxx11_(&local_58,this);
              tinyformat::format<std::__cxx11::string>
                        ((string *)local_a8,
                         (tinyformat *)"tx %s was part of a too-large package RBF subpackage",
                         (char *)&local_58,pbVar16);
              goto LAB_0069d41d;
            }
            p_Var14 = (plVar1->
                      super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      )._M_impl._M_node.super__List_node_base._M_next;
          }
          if ((mempool != (CTxMemPool *)0x0) && (p_Var14 != (_List_node_base *)plVar1)) {
            args_1 = (CTxMemPool *)0x56;
            UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                      (&criticalblock7,&mempool->cs,"mempool->cs",
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
                       ,0x56,false);
            if (((pmVar12->m_wtxids_fee_calculations).
                 super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                 ._M_engaged == true) &&
               (pvVar13 = std::
                          optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                          ::value(&pmVar12->m_wtxids_fee_calculations),
               (long)(pvVar13->
                     super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar13->
                     super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     )._M_impl.super__Vector_impl_data._M_start == 0x40)) {
              pcVar8 = (pbVar15->_M_dataplus)._M_p;
              local_a8[0x10] = (undefined1)*(undefined8 *)(pcVar8 + 0x49);
              local_a8._17_7_ = (undefined7)((ulong)*(undefined8 *)(pcVar8 + 0x49) >> 8);
              local_a8[0x18] = (undefined1)*(undefined8 *)(pcVar8 + 0x51);
              local_a8._25_7_ = (undefined7)((ulong)*(undefined8 *)(pcVar8 + 0x51) >> 8);
              local_a8[0] = (undefined1)*(undefined8 *)(pcVar8 + 0x39);
              local_a8._1_7_ = (undefined7)((ulong)*(undefined8 *)(pcVar8 + 0x39) >> 8);
              local_a8[8] = (undefined1)*(undefined8 *)(pcVar8 + 0x41);
              local_a8._9_7_ = (undefined7)((ulong)*(undefined8 *)(pcVar8 + 0x41) >> 8);
              pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_b9;
              __l._M_len = 1;
              __l._M_array = (iterator)local_a8;
              std::vector<uint256,_std::allocator<uint256>_>::vector
                        ((vector<uint256,_std::allocator<uint256>_> *)&local_58,__l,
                         (allocator_type *)pbVar16);
              CTxMemPool::GatherClusters
                        (&cluster,mempool,(vector<uint256,_std::allocator<uint256>_> *)&local_58);
              std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                        ((_Vector_base<uint256,_std::allocator<uint256>_> *)&local_58);
              if ((long)cluster.
                        super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)cluster.
                        super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0x10) {
                base_blob<256u>::ToString_abi_cxx11_(&local_58,this);
                tinyformat::format<std::__cxx11::string>
                          ((string *)local_a8,
                           (tinyformat *)
                           "tx %s has too many ancestors or descendants for a package rbf",
                           (char *)&local_58,pbVar16);
                std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          (__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a8);
                std::__cxx11::string::~string((string *)local_a8);
                std::__cxx11::string::~string((string *)&local_58);
                std::
                _Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                ::~_Vector_base(&cluster.
                                 super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                               );
                std::unique_lock<std::recursive_mutex>::~unique_lock
                          (&criticalblock7.super_unique_lock);
                goto LAB_0069d43d;
              }
              std::
              _Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
              ::~_Vector_base(&cluster.
                               super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                             );
            }
            std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
          }
        }
        bVar18 = RVar3 == VALID;
        RVar4 = pmVar12->m_result_type;
        bVar19 = RVar4 == MEMPOOL_ENTRY;
        if ((bVar19 || bVar18) !=
            (pmVar12->m_base_fees).super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_engaged) {
          base_blob<256u>::ToString_abi_cxx11_(&local_58,this);
          pcVar17 = "not ";
          if (bVar19 || bVar18) {
            pcVar17 = "";
          }
          cluster.
          super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar17;
          tinyformat::format<std::__cxx11::string,char_const*>
                    ((string *)local_a8,(tinyformat *)"tx %s result should %shave m_base_fees",
                     (char *)&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cluster,
                     (char **)args_1);
          goto LAB_0069d41d;
        }
        if ((bVar19 || bVar18) !=
            (pmVar12->m_vsize).super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_engaged) {
          base_blob<256u>::ToString_abi_cxx11_(&local_58,this);
          pcVar17 = "not ";
          if (bVar19 || bVar18) {
            pcVar17 = "";
          }
          cluster.
          super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar17;
          tinyformat::format<std::__cxx11::string,char_const*>
                    ((string *)local_a8,(tinyformat *)"tx %s result should %shave m_vsize",
                     (char *)&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cluster,
                     (char **)args_1);
          goto LAB_0069d41d;
        }
        if ((RVar4 == DIFFERENT_WITNESS) !=
            (pmVar12->m_other_wtxid).super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_engaged) {
          base_blob<256u>::ToString_abi_cxx11_(&local_58,this);
          pcVar17 = "not ";
          if (RVar4 == DIFFERENT_WITNESS) {
            pcVar17 = "";
          }
          cluster.
          super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar17;
          tinyformat::format<std::__cxx11::string,char_const*>
                    ((string *)local_a8,(tinyformat *)"tx %s result should %shave m_other_wtxid",
                     (char *)&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cluster,
                     (char **)args_1);
          goto LAB_0069d41d;
        }
        bVar18 = (pmVar12->m_effective_feerate).super__Optional_base<CFeeRate,_true,_true>.
                 _M_payload.super__Optional_payload_base<CFeeRate>._M_engaged;
        if (bVar18 != ((pmVar12->m_state).super_ValidationState<TxValidationResult>.m_result ==
                       TX_RECONSIDERABLE || RVar4 == VALID)) {
          base_blob<256u>::ToString_abi_cxx11_(&local_58,this);
          pcVar17 = "not ";
          if (RVar3 == VALID) {
            pcVar17 = "";
          }
          cluster.
          super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar17;
          tinyformat::format<std::__cxx11::string,char_const*>
                    ((string *)local_a8,
                     (tinyformat *)"tx %s result should %shave m_effective_feerate",
                     (char *)&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cluster,
                     (char **)args_1);
          goto LAB_0069d41d;
        }
        if ((pmVar12->m_wtxids_fee_calculations).
            super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
            ._M_engaged != bVar18) {
          base_blob<256u>::ToString_abi_cxx11_(&local_58,this);
          pcVar17 = "not ";
          if (RVar3 == VALID) {
            pcVar17 = "";
          }
          cluster.
          super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar17;
          tinyformat::format<std::__cxx11::string,char_const*>
                    ((string *)local_a8,
                     (tinyformat *)"tx %s result should %shave m_effective_feerate",
                     (char *)&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cluster,
                     (char **)args_1);
          goto LAB_0069d41d;
        }
        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_a8 + 1);
        if (mempool != (CTxMemPool *)0x0) {
          pcVar8 = (pbVar15->_M_dataplus)._M_p;
          local_a8[0] = '\0';
          local_a8._17_7_ = (undefined7)*(undefined8 *)(pcVar8 + 0x49);
          local_a8[0x18] = (undefined1)((ulong)*(undefined8 *)(pcVar8 + 0x49) >> 0x38);
          local_a8._25_7_ = (undefined7)*(undefined8 *)(pcVar8 + 0x51);
          uStack_88 = (uchar)((ulong)*(undefined8 *)(pcVar8 + 0x51) >> 0x38);
          local_a8._1_7_ = (undefined7)*(undefined8 *)(pcVar8 + 0x39);
          local_a8[8] = (undefined1)((ulong)*(undefined8 *)(pcVar8 + 0x39) >> 0x38);
          local_a8._9_7_ = (undefined7)*(undefined8 *)(pcVar8 + 0x41);
          local_a8[0x10] = (undefined1)((ulong)*(undefined8 *)(pcVar8 + 0x41) >> 0x38);
          bVar18 = CTxMemPool::exists(mempool,(GenTxid *)local_a8);
          if ((RVar4 != INVALID) != bVar18) {
            base_blob<256u>::ToString_abi_cxx11_(&local_58,this);
            pcVar17 = "not ";
            if (RVar4 != INVALID) {
              pcVar17 = "";
            }
            cluster.
            super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar17;
            tinyformat::format<std::__cxx11::string,char_const*>
                      ((string *)local_a8,(tinyformat *)"tx %s should %sbe in mempool",
                       (char *)&local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cluster
                       ,(char **)args_1);
            goto LAB_0069d41d;
          }
          p_Var14 = (_List_node_base *)plVar1;
          if (((pbVar15->_M_dataplus)._M_p[0x38] == '\x01') &&
             (pmVar12->m_result_type == DIFFERENT_WITNESS)) {
            local_a8[0] = '\x01';
            local_a8._17_7_ = (undefined7)*(undefined8 *)(pcVar7 + 0x69);
            local_a8[0x18] = (undefined1)((ulong)*(undefined8 *)(pcVar7 + 0x69) >> 0x38);
            local_a8._25_7_ = (undefined7)*(undefined8 *)(pcVar7 + 0x71);
            uStack_88 = (uchar)((ulong)*(undefined8 *)(pcVar7 + 0x71) >> 0x38);
            local_a8._1_7_ = (undefined7)*(undefined8 *)this;
            local_a8[8] = (undefined1)((ulong)*(undefined8 *)this >> 0x38);
            local_a8._9_7_ = (undefined7)*(undefined8 *)(pcVar7 + 0x61);
            local_a8[0x10] = (undefined1)((ulong)*(undefined8 *)(pcVar7 + 0x61) >> 0x38);
            bVar18 = CTxMemPool::exists(mempool,(GenTxid *)local_a8);
            if (bVar18) {
              base_blob<256u>::ToString_abi_cxx11_(&local_58,this);
              tinyformat::format<std::__cxx11::string>
                        ((string *)local_a8,(tinyformat *)"wtxid %s should not be in mempool",
                         (char *)&local_58,pbVar16);
              goto LAB_0069d41d;
            }
          }
          while (p_Var14 = (((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                p_Var14 != (_List_node_base *)plVar1) {
            lVar9 = (long)p_Var14[1]._M_next;
            local_a8[0] = '\0';
            local_a8._17_7_ = (undefined7)*(undefined8 *)(lVar9 + 0x49);
            local_a8[0x18] = (undefined1)((ulong)*(undefined8 *)(lVar9 + 0x49) >> 0x38);
            local_a8._25_7_ = (undefined7)*(undefined8 *)(lVar9 + 0x51);
            uStack_88 = (uchar)((ulong)*(undefined8 *)(lVar9 + 0x51) >> 0x38);
            local_a8._1_7_ = (undefined7)*(undefined8 *)(lVar9 + 0x39);
            local_a8[8] = (undefined1)((ulong)*(undefined8 *)(lVar9 + 0x39) >> 0x38);
            local_a8._9_7_ = (undefined7)*(undefined8 *)(lVar9 + 0x41);
            local_a8[0x10] = (undefined1)((ulong)*(undefined8 *)(lVar9 + 0x41) >> 0x38);
            bVar18 = CTxMemPool::exists(mempool,(GenTxid *)local_a8);
            if (bVar18) {
              base_blob<256u>::ToString_abi_cxx11_
                        (&local_58,(base_blob<256u> *)((long)p_Var14[1]._M_next + 0x59));
              tinyformat::format<std::__cxx11::string>
                        ((string *)local_a8,
                         (tinyformat *)"tx %s should not be in mempool as it was replaced",
                         (char *)&local_58,pbVar16);
              goto LAB_0069d41d;
            }
          }
        }
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      goto LAB_0069d43d;
    }
    phVar10 = (pointer)((long)pbVar5 - (long)pbVar15 >> 4);
    phVar6 = (pointer)(result->m_tx_results)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (phVar10 == phVar6) goto LAB_0069d0c7;
    __return_storage_ptr___00 = (string *)local_a8;
    cluster.
    super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
    ._M_impl.super__Vector_impl_data._M_start = phVar6;
    local_58._M_dataplus._M_p = (pointer)phVar10;
    tinyformat::format<unsigned_long,unsigned_long>
              (__return_storage_ptr___00,
               (tinyformat *)"txns size %u does not match tx results size %u",(char *)&local_58,
               (unsigned_long *)&cluster,(unsigned_long *)mempool);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,__return_storage_ptr___00);
  }
  std::__cxx11::string::~string((string *)__return_storage_ptr___00);
LAB_0069d43d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> CheckPackageMempoolAcceptResult(const Package& txns,
                                                           const PackageMempoolAcceptResult& result,
                                                           bool expect_valid,
                                                           const CTxMemPool* mempool)
{
    if (expect_valid) {
        if (result.m_state.IsInvalid()) {
            return strprintf("Package validation unexpectedly failed: %s", result.m_state.ToString());
        }
    } else {
        if (result.m_state.IsValid()) {
            return strprintf("Package validation unexpectedly succeeded. %s", result.m_state.ToString());
        }
    }
    if (result.m_state.GetResult() != PackageValidationResult::PCKG_POLICY && txns.size() != result.m_tx_results.size()) {
        return strprintf("txns size %u does not match tx results size %u", txns.size(), result.m_tx_results.size());
    }
    for (const auto& tx : txns) {
        const auto& wtxid = tx->GetWitnessHash();
        if (result.m_tx_results.count(wtxid) == 0) {
            return strprintf("result not found for tx %s", wtxid.ToString());
        }

        const auto& atmp_result = result.m_tx_results.at(wtxid);
        const bool valid{atmp_result.m_result_type == MempoolAcceptResult::ResultType::VALID};
        if (expect_valid && atmp_result.m_state.IsInvalid()) {
            return strprintf("tx %s unexpectedly failed: %s", wtxid.ToString(), atmp_result.m_state.ToString());
        }

        // Each subpackage is allowed MAX_REPLACEMENT_CANDIDATES replacements (only checking individually here)
        if (atmp_result.m_replaced_transactions.size() > MAX_REPLACEMENT_CANDIDATES) {
            return strprintf("tx %s result replaced too many transactions",
                                wtxid.ToString());
        }

        // Replacements can't happen for subpackages larger than 2
        if (!atmp_result.m_replaced_transactions.empty() &&
            atmp_result.m_wtxids_fee_calculations.has_value() && atmp_result.m_wtxids_fee_calculations.value().size() > 2) {
             return strprintf("tx %s was part of a too-large package RBF subpackage",
                                wtxid.ToString());
        }

        if (!atmp_result.m_replaced_transactions.empty() && mempool) {
            LOCK(mempool->cs);
            // If replacements occurred and it used 2 transactions, this is a package RBF and should result in a cluster of size 2
            if (atmp_result.m_wtxids_fee_calculations.has_value() && atmp_result.m_wtxids_fee_calculations.value().size() == 2) {
                const auto cluster = mempool->GatherClusters({tx->GetHash()});
                if (cluster.size() != 2) return strprintf("tx %s has too many ancestors or descendants for a package rbf", wtxid.ToString());
            }
        }

        // m_vsize and m_base_fees should exist iff the result was VALID or MEMPOOL_ENTRY
        const bool mempool_entry{atmp_result.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY};
        if (atmp_result.m_base_fees.has_value() != (valid || mempool_entry)) {
            return strprintf("tx %s result should %shave m_base_fees", wtxid.ToString(), valid || mempool_entry ? "" : "not ");
        }
        if (atmp_result.m_vsize.has_value() != (valid || mempool_entry)) {
            return strprintf("tx %s result should %shave m_vsize", wtxid.ToString(), valid || mempool_entry ? "" : "not ");
        }

        // m_other_wtxid should exist iff the result was DIFFERENT_WITNESS
        const bool diff_witness{atmp_result.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS};
        if (atmp_result.m_other_wtxid.has_value() != diff_witness) {
            return strprintf("tx %s result should %shave m_other_wtxid", wtxid.ToString(), diff_witness ? "" : "not ");
        }

        // m_effective_feerate and m_wtxids_fee_calculations should exist iff the result was valid
        // or if the failure was TX_RECONSIDERABLE
        const bool valid_or_reconsiderable{atmp_result.m_result_type == MempoolAcceptResult::ResultType::VALID ||
                    atmp_result.m_state.GetResult() == TxValidationResult::TX_RECONSIDERABLE};
        if (atmp_result.m_effective_feerate.has_value() != valid_or_reconsiderable) {
            return strprintf("tx %s result should %shave m_effective_feerate",
                                    wtxid.ToString(), valid ? "" : "not ");
        }
        if (atmp_result.m_wtxids_fee_calculations.has_value() != valid_or_reconsiderable) {
            return strprintf("tx %s result should %shave m_effective_feerate",
                                    wtxid.ToString(), valid ? "" : "not ");
        }

        if (mempool) {
            // The tx by txid should be in the mempool iff the result was not INVALID.
            const bool txid_in_mempool{atmp_result.m_result_type != MempoolAcceptResult::ResultType::INVALID};
            if (mempool->exists(GenTxid::Txid(tx->GetHash())) != txid_in_mempool) {
                return strprintf("tx %s should %sbe in mempool", wtxid.ToString(), txid_in_mempool ? "" : "not ");
            }
            // Additionally, if the result was DIFFERENT_WITNESS, we shouldn't be able to find the tx in mempool by wtxid.
            if (tx->HasWitness() && atmp_result.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS) {
                if (mempool->exists(GenTxid::Wtxid(wtxid))) {
                    return strprintf("wtxid %s should not be in mempool", wtxid.ToString());
                }
            }
            for (const auto& tx_ref : atmp_result.m_replaced_transactions) {
                if (mempool->exists(GenTxid::Txid(tx_ref->GetHash()))) {
                    return strprintf("tx %s should not be in mempool as it was replaced", tx_ref->GetWitnessHash().ToString());
                }
            }
        }
    }
    return std::nullopt;
}